

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::(anonymous_namespace)::GeneratedMessageReflectionSwapTest_BothSet_Test>
::CreateTest(ParameterizedTestFactory<google::protobuf::(anonymous_namespace)::GeneratedMessageReflectionSwapTest_BothSet_Test>
             *this)

{
  Test *this_00;
  
  WithParamInterface<bool>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  google::protobuf::anon_unknown_0::GeneratedMessageReflectionSwapTest::
  GeneratedMessageReflectionSwapTest((GeneratedMessageReflectionSwapTest *)this_00);
  (((TestWithParam<bool> *)&this_00->_vptr_Test)->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestWithParam_01614b68;
  this_00[1]._vptr_Test =
       (_func_int **)&PTR__GeneratedMessageReflectionSwapTest_BothSet_Test_01614ba8;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }